

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerGraph.h
# Opt level: O2

PSNodesSeq * __thiscall
dg::pta::LLVMPointerGraphBuilder::getNodes(LLVMPointerGraphBuilder *this,Value *val)

{
  _Node_iterator_base<std::pair<const_llvm::Value_*const,_dg::pta::LLVMPointerGraphBuilder::PSNodesSeq>,_false>
  _Var1;
  Value *local_8;
  
  local_8 = val;
  _Var1._M_cur = (__node_type *)
                 std::
                 _Hashtable<const_llvm::Value_*,_std::pair<const_llvm::Value_*const,_dg::pta::LLVMPointerGraphBuilder::PSNodesSeq>,_std::allocator<std::pair<const_llvm::Value_*const,_dg::pta::LLVMPointerGraphBuilder::PSNodesSeq>_>,_std::__detail::_Select1st,_std::equal_to<const_llvm::Value_*>,_std::hash<const_llvm::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 ::find(&(this->nodes_map)._M_h,&local_8);
  if (_Var1._M_cur != (__node_type *)0x0) {
    _Var1._M_cur = (__node_type *)((long)_Var1._M_cur + 0x10);
  }
  return (PSNodesSeq *)_Var1._M_cur;
}

Assistant:

PSNodesSeq *getNodes(const llvm::Value *val) {
        auto it = nodes_map.find(val);
        if (it == nodes_map.end())
            return nullptr;

        // the node corresponding to the real llvm value
        // is always the last
        return &it->second;
    }